

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O0

int Rpo_computeMinEdgeCost(Rpo_LCI_Edge_t **edges,int edgeCount,int *vertexDegree)

{
  Rpo_LCI_Edge_t *pRVar1;
  uint uVar2;
  uint local_48;
  uint local_44;
  int i;
  int minVertex;
  uint edgeCost;
  Rpo_LCI_Edge_t *edge;
  uint local_28;
  uint minCost;
  int minVertexIndex;
  int minCostIndex;
  int *vertexDegree_local;
  int edgeCount_local;
  Rpo_LCI_Edge_t **edges_local;
  
  minCost = 0xffffffff;
  local_28 = 0xffffffff;
  edge._4_4_ = 0xffffffff;
  for (local_44 = 0; (int)local_44 < edgeCount; local_44 = local_44 + 1) {
    pRVar1 = edges[(int)local_44];
    if (((ulong)*pRVar1 & 1) == 0) {
      uVar2 = vertexDegree[(ulong)*pRVar1 >> 4 & 0x3fffffff] + vertexDegree[(ulong)*pRVar1 >> 0x22];
      if (((uint)((ulong)*pRVar1 >> 4) & 0x3fffffff) < SUB84(*pRVar1,4) >> 2) {
        local_48 = (uint)((ulong)*pRVar1 >> 4) & 0x3fffffff;
      }
      else {
        local_48 = SUB84(*pRVar1,4) >> 2;
      }
      if (uVar2 < edge._4_4_) {
        minCost = local_44;
        local_28 = local_48;
        edge._4_4_ = uVar2;
      }
      else if ((uVar2 == edge._4_4_) && ((int)local_48 < (int)local_28)) {
        minCost = local_44;
        local_28 = local_48;
        edge._4_4_ = uVar2;
      }
    }
  }
  return minCost;
}

Assistant:

int Rpo_computeMinEdgeCost(Rpo_LCI_Edge_t** edges, int edgeCount, int* vertexDegree) {
    int minCostIndex = -1;
    int minVertexIndex = -1;
    unsigned int minCost = ~0;
    Rpo_LCI_Edge_t* edge;
    unsigned int edgeCost;
    int minVertex;
    int i;
    for (i = 0; i < edgeCount; ++i) {
        edge = edges[i];
        if (!edge->visited) {
            edgeCost = vertexDegree[edge->idx1] + vertexDegree[edge->idx2];
            minVertex = (edge->idx1 < edge->idx2) ? edge->idx1 : edge->idx2;
            if (edgeCost < minCost) {
                minCost = edgeCost;
                minCostIndex = i;
                minVertexIndex = minVertex;
            } else if ((edgeCost == minCost) && minVertex < minVertexIndex) {
                minCost = edgeCost;
                minCostIndex = i;
                minVertexIndex = minVertex;
            }
        }
    }
    return minCostIndex;
}